

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O1

Vec_Int_t * Fra_ImpDerive(Fra_Man_t *p,int nImpMaxLimit,int nImpUseLimit,int fLatchCorr)

{
  int *piVar1;
  uint *puVar2;
  int iVar3;
  int *piVar4;
  void **__ptr;
  void *__ptr_00;
  bool bVar5;
  int iVar6;
  Vec_Ptr_t *__ptr_01;
  ulong uVar7;
  int *piVar8;
  ulong uVar9;
  Vec_Int_t *pVVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  Fra_Sml_t *pFVar14;
  uint uVar15;
  undefined4 in_register_00000034;
  int iVar16;
  uint *pSimR;
  uint uVar17;
  int *piVar18;
  ulong uVar19;
  Vec_Int_t *pVVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  int CostRange;
  timespec ts;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  int *local_d0;
  Vec_Int_t *local_c8;
  ulong local_c0;
  Fra_Sml_t *local_b8;
  Fra_Sml_t *local_b0;
  uint *local_a8;
  int local_a0;
  int local_9c;
  long local_98;
  Vec_Ptr_t *local_90;
  ulong local_88;
  ulong local_80;
  timespec local_78;
  ulong local_68;
  ulong local_60;
  Fra_Man_t *local_58;
  ulong local_50;
  void **local_48;
  Fra_Sml_t *local_40;
  Fra_Sml_t *local_38;
  
  local_c0 = CONCAT44(in_register_00000034,nImpMaxLimit);
  iVar6 = clock_gettime(3,&local_78);
  if (iVar6 < 0) {
    lVar13 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  if (0x7fff < p->pManAig->vObjs->nSize) {
    __assert_fail("Aig_ManObjNumMax(p->pManAig) < (1 << 15)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraImp.c"
                  ,0x14c,"Vec_Int_t *Fra_ImpDerive(Fra_Man_t *, int, int, int)");
  }
  if ((((int)local_c0 < nImpUseLimit) || ((int)local_c0 < 1)) || (nImpUseLimit < 1)) {
    __assert_fail("nImpMaxLimit > 0 && nImpUseLimit > 0 && nImpUseLimit <= nImpMaxLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraImp.c"
                  ,0x14d,"Vec_Int_t *Fra_ImpDerive(Fra_Man_t *, int, int, int)");
  }
  uVar15 = 0;
  local_b0 = Fra_SmlSimulateComb(p->pManAig,0x40,0);
  local_b8 = Fra_SmlSimulateSeq(p->pManAig,p->pPars->nFramesP,0x40,1,1);
  __ptr_01 = Fra_SmlSortUsingOnes(local_b8,fLatchCorr);
  uVar19 = local_c0;
  uVar7 = 0x800;
  do {
    if (1 < uVar7) {
      uVar12 = uVar7;
      do {
        if ((long)__ptr_01->nSize < (long)uVar7) goto LAB_0065e590;
        piVar8 = (int *)__ptr_01->pArray[uVar12 - 1 & 0xffffffff];
        if (*piVar8 != 0) {
          if ((long)__ptr_01->nSize <= (long)uVar7) goto LAB_0065e590;
          piVar4 = (int *)__ptr_01->pArray[uVar7];
          piVar18 = piVar4;
          iVar6 = *piVar4;
          do {
            while (iVar6 != 0) {
              piVar18 = piVar18 + 1;
              uVar15 = uVar15 + 1;
              iVar6 = *piVar18;
            }
            piVar1 = piVar8 + 1;
            piVar8 = piVar8 + 1;
            piVar18 = piVar4;
            iVar6 = *piVar4;
          } while (*piVar1 != 0);
        }
        bVar5 = 2 < (long)uVar12;
        uVar12 = uVar12 - 1;
      } while (bVar5);
    }
    bVar5 = 1 < uVar7;
    uVar7 = uVar7 - 1;
  } while (bVar5);
  local_d0 = (int *)malloc((local_c0 & 0xffffffff) << 2);
  local_c8 = (Vec_Int_t *)malloc(0x10);
  uVar11 = 0x10;
  if (0xe < (uint)uVar19 - 1) {
    uVar11 = (uint)uVar19;
  }
  local_c8->nSize = 0;
  local_c8->nCap = uVar11;
  if (uVar11 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((ulong)uVar11 << 2);
  }
  local_c8->pArray = piVar8;
  pFVar14 = local_b8;
  pVVar20 = local_c8;
  local_9c = nImpUseLimit;
  local_98 = lVar13;
  local_58 = p;
  if (local_b8->nWordsTotal < 1) {
    local_e4 = 1000000000;
    local_dc = 0;
    local_d8 = 0;
    local_e0 = 0;
    uVar7 = 0;
    uVar19 = 0;
  }
  else {
    local_40 = local_b0 + 1;
    local_38 = local_b8 + 1;
    local_e4 = 1000000000;
    local_e0 = 0;
    local_d8 = 0;
    local_dc = 0;
    uVar19 = 0;
    uVar12 = (ulong)(uint)(local_b8->nWordsTotal << 5);
    uVar23 = 0;
    do {
      uVar7 = uVar23;
      if (1 < (int)uVar12) {
        local_a0 = __ptr_01->nSize;
        uVar9 = uVar12;
        local_90 = __ptr_01;
        local_50 = uVar12;
        do {
          if (local_a0 < (int)uVar12) goto LAB_0065e590;
          local_60 = uVar9 - 1;
          local_48 = __ptr_01->pArray;
          local_a8 = (uint *)local_48[local_60 & 0xffffffff];
          local_68 = uVar9;
          if (*local_a8 != 0) {
            if (local_a0 <= (int)uVar12) goto LAB_0065e590;
            do {
              piVar8 = (int *)local_48[uVar12];
              iVar6 = *piVar8;
              while (pVVar10 = local_c8, iVar6 != 0) {
                uVar19 = (ulong)((int)uVar19 + 1);
                uVar11 = *local_a8;
                iVar16 = pFVar14->nWordsTotal;
                iVar3 = pFVar14->nWordsPref;
                if (iVar3 < iVar16) {
                  lVar13 = 0;
                  do {
                    if ((*(uint *)((long)&local_38->pAig +
                                  lVar13 * 4 + (long)(int)(iVar16 * uVar11) * 4 + (long)iVar3 * 4) &
                        ~*(uint *)((long)&local_38->pAig +
                                  lVar13 * 4 + (long)(iVar16 * iVar6) * 4 + (long)iVar3 * 4)) != 0)
                    {
                      local_dc = local_dc + 1;
                      goto LAB_0065e35e;
                    }
                    lVar13 = lVar13 + 1;
                  } while (iVar16 - iVar3 != (int)lVar13);
                }
                iVar16 = local_b0->nWordsTotal;
                iVar3 = local_b0->nWordsPref;
                lVar13 = (long)iVar3;
                local_88 = uVar23;
                local_80 = uVar19;
                if (iVar3 < iVar16) {
                  lVar22 = 0;
LAB_0065e245:
                  if ((*(uint *)((long)&local_40->pAig +
                                lVar22 * 4 + (long)(int)(iVar16 * uVar11) * 4 + lVar13 * 4) &
                      ~*(uint *)((long)&local_40->pAig +
                                lVar22 * 4 + (long)(iVar16 * iVar6) * 4 + lVar13 * 4)) == 0)
                  goto code_r0x0065e251;
                  uVar17 = 0;
                  if (iVar3 < iVar16) {
                    uVar17 = 0;
                    do {
                      uVar21 = ~*(uint *)((long)&local_40->pAig +
                                         lVar13 * 4 + (long)(iVar16 * iVar6) * 4) &
                               *(uint *)((long)&local_40->pAig +
                                        lVar13 * 4 + (long)(int)(iVar16 * uVar11) * 4);
                      uVar21 = (uVar21 >> 1 & 0x55555555) + (uVar21 & 0x55555555);
                      uVar21 = (uVar21 >> 2 & 0x33333333) + (uVar21 & 0x33333333);
                      uVar21 = (uVar21 >> 4 & 0x7070707) + (uVar21 & 0x7070707);
                      uVar21 = (uVar21 >> 8 & 0xf000f) + (uVar21 & 0xf000f);
                      uVar17 = (uVar21 >> 0x10) + uVar17 + (uVar21 & 0xffff);
                      lVar13 = lVar13 + 1;
                    } while (iVar16 != lVar13);
                  }
                  local_e0 = local_e0 + 1;
                  if ((int)uVar17 <= (int)local_e4) {
                    local_e4 = uVar17;
                  }
                  local_d0[local_c8->nSize] = uVar17;
                  uVar7 = (ulong)uVar17;
                  if ((int)uVar17 < (int)uVar23) {
                    uVar7 = uVar23;
                  }
                  Vec_IntPush(local_c8,uVar11 | iVar6 << 0x10);
                  pFVar14 = local_b8;
                  uVar19 = local_80;
                  __ptr_01 = local_90;
                  pVVar20 = local_c8;
                  uVar23 = uVar7;
                  if (pVVar10->nSize != (int)local_c0) goto LAB_0065e35e;
                  goto LAB_0065e3e9;
                }
LAB_0065e259:
                local_d8 = local_d8 + 1;
                pFVar14 = local_b8;
                __ptr_01 = local_90;
LAB_0065e35e:
                piVar4 = piVar8 + 1;
                piVar8 = piVar8 + 1;
                iVar6 = *piVar4;
              }
              puVar2 = local_a8 + 1;
              local_a8 = local_a8 + 1;
              uVar12 = local_50;
            } while (*puVar2 != 0);
          }
          uVar9 = local_60;
          pVVar20 = local_c8;
          uVar7 = uVar23;
        } while (2 < (int)local_68);
      }
      iVar6 = (int)uVar12;
      uVar12 = uVar12 - 1;
      uVar23 = uVar7;
    } while (1 < iVar6);
  }
LAB_0065e3e9:
  Fra_SmlStop(local_b0);
  Fra_SmlStop(pFVar14);
  local_d4 = local_e4;
  pVVar10 = pVVar20;
  if (local_9c < pVVar20->nSize) {
    pVVar10 = Fra_SmlSelectMaxCost(pVVar20,local_d0,0x800,local_9c,(int *)&local_d4);
    if (pVVar20->pArray != (int *)0x0) {
      free(pVVar20->pArray);
      pVVar20->pArray = (int *)0x0;
    }
    free(pVVar20);
  }
  if (local_d0 != (int *)0x0) {
    free(local_d0);
  }
  if (0 < __ptr_01->nSize) {
    __ptr = __ptr_01->pArray;
    __ptr_00 = *__ptr;
    if (__ptr_00 != (void *)0x0) {
      free(__ptr_00);
    }
    free(__ptr);
    __ptr_01->pArray = (void **)0x0;
    if (__ptr_01 != (Vec_Ptr_t *)0x0) {
      free(__ptr_01);
    }
    qsort(pVVar10->pArray,(long)pVVar10->nSize,4,Sml_CompareMaxId);
    if (local_58->pPars->fVerbose != 0) {
      printf("Implications: All = %d. Try = %d. NonSeq = %d. Comb = %d. Res = %d.\n",(ulong)uVar15,
             uVar19 & 0xffffffff,(ulong)local_dc,(ulong)local_d8,(ulong)local_e0);
      iVar6 = 0x9db7db;
      printf("Implication weight: Min = %d. Pivot = %d. Max = %d.   ",(ulong)local_e4,
             (ulong)local_d4,uVar7);
      Abc_Print(iVar6,"%s =","Time");
      iVar16 = 3;
      iVar6 = clock_gettime(3,&local_78);
      if (iVar6 < 0) {
        lVar13 = -1;
      }
      else {
        lVar13 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
      }
      Abc_Print(iVar16,"%9.2f sec\n",(double)(lVar13 + local_98) / 1000000.0);
    }
    return pVVar10;
  }
LAB_0065e590:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
code_r0x0065e251:
  lVar22 = lVar22 + 1;
  if (iVar16 - iVar3 == (int)lVar22) goto LAB_0065e259;
  goto LAB_0065e245;
}

Assistant:

Vec_Int_t * Fra_ImpDerive( Fra_Man_t * p, int nImpMaxLimit, int nImpUseLimit, int fLatchCorr )
{
    int nSimWords = 64;
    Fra_Sml_t * pSeq, * pComb;
    Vec_Int_t * vImps, * vTemp;
    Vec_Ptr_t * vNodes;
    int * pImpCosts, * pNodesI, * pNodesK;
    int nImpsTotal = 0, nImpsTried = 0, nImpsNonSeq = 0, nImpsComb = 0, nImpsCollected = 0;
    int CostMin = ABC_INFINITY, CostMax = 0;
    int i, k, Imp, CostRange;
    abctime clk = Abc_Clock();
    assert( Aig_ManObjNumMax(p->pManAig) < (1 << 15) );
    assert( nImpMaxLimit > 0 && nImpUseLimit > 0 && nImpUseLimit <= nImpMaxLimit );
    // normalize both managers
    pComb = Fra_SmlSimulateComb( p->pManAig, nSimWords, 0 );
    pSeq = Fra_SmlSimulateSeq( p->pManAig, p->pPars->nFramesP, nSimWords, 1, 1 );
    // get the nodes sorted by the number of 1s
    vNodes = Fra_SmlSortUsingOnes( pSeq, fLatchCorr );
    // count the total number of implications
    for ( k = nSimWords * 32; k > 0; k-- )
    for ( i = k - 1; i > 0; i-- )
    for ( pNodesI = (int *)Vec_PtrEntry( vNodes, i ); *pNodesI; pNodesI++ )
    for ( pNodesK = (int *)Vec_PtrEntry( vNodes, k ); *pNodesK; pNodesK++ )
        nImpsTotal++;

    // compute implications and their costs
    pImpCosts = ABC_ALLOC( int, nImpMaxLimit );
    vImps = Vec_IntAlloc( nImpMaxLimit );
    for ( k = pSeq->nWordsTotal * 32; k > 0; k-- )
        for ( i = k - 1; i > 0; i-- )
        {
            // HERE WE ARE MISSING SOME POTENTIAL IMPLICATIONS (with complement!)

            for ( pNodesI = (int *)Vec_PtrEntry( vNodes, i ); *pNodesI; pNodesI++ )
            for ( pNodesK = (int *)Vec_PtrEntry( vNodes, k ); *pNodesK; pNodesK++ )
            {
                nImpsTried++;
                if ( !Sml_NodeCheckImp(pSeq, *pNodesI, *pNodesK) )
                {
                    nImpsNonSeq++;
                    continue;
                }
                if ( Sml_NodeCheckImp(pComb, *pNodesI, *pNodesK) )
                {
                    nImpsComb++;
                    continue;
                }
                nImpsCollected++;
                Imp = Fra_ImpCreate( *pNodesI, *pNodesK );
                pImpCosts[ Vec_IntSize(vImps) ] = Sml_NodeNotImpWeight(pComb, *pNodesI, *pNodesK);
                CostMin = Abc_MinInt( CostMin, pImpCosts[ Vec_IntSize(vImps) ] );
                CostMax = Abc_MaxInt( CostMax, pImpCosts[ Vec_IntSize(vImps) ] );
                Vec_IntPush( vImps, Imp );
                if ( Vec_IntSize(vImps) == nImpMaxLimit )
                    goto finish;
            } 
        }
finish:
    Fra_SmlStop( pComb );
    Fra_SmlStop( pSeq );

    // select implications with the highest cost
    CostRange = CostMin;
    if ( Vec_IntSize(vImps) > nImpUseLimit )
    {
        vImps = Fra_SmlSelectMaxCost( vTemp = vImps, pImpCosts, nSimWords * 32, nImpUseLimit, &CostRange );
        Vec_IntFree( vTemp );  
    }

    // dealloc
    ABC_FREE( pImpCosts ); 
    {
    void * pTemp = Vec_PtrEntry(vNodes, 0);
    ABC_FREE( pTemp );
    }
    Vec_PtrFree( vNodes );
    // reorder implications topologically
    qsort( (void *)Vec_IntArray(vImps), (size_t)Vec_IntSize(vImps), sizeof(int), 
            (int (*)(const void *, const void *)) Sml_CompareMaxId );
if ( p->pPars->fVerbose )
{
printf( "Implications: All = %d. Try = %d. NonSeq = %d. Comb = %d. Res = %d.\n", 
    nImpsTotal, nImpsTried, nImpsNonSeq, nImpsComb, nImpsCollected );
printf( "Implication weight: Min = %d. Pivot = %d. Max = %d.   ", 
       CostMin, CostRange, CostMax );
ABC_PRT( "Time", Abc_Clock() - clk );
}
    return vImps;
}